

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O1

ssize_t __thiscall
wasm::LEB<int,_signed_char>::read(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  string *psVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  ulong uVar6;
  
  uVar5 = CONCAT44(in_register_00000034,__fd);
  this->value = 0;
  uVar9 = 0;
  uVar6 = uVar5;
  do {
    if (*(long *)(uVar5 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (**(code **)(uVar5 + 0x18))(uVar5,uVar6,__buf,__nbytes);
    uVar7 = (-(uint)(uVar9 == 0) | ~(-1 << (-(byte)uVar9 & 0x1f))) & 0x7f;
    __nbytes = (size_t)uVar9;
    uVar8 = uVar7 ^ 0x7f;
    uVar4 = bVar1 & uVar8;
    uVar6 = (ulong)uVar4;
    uVar7 = (uVar7 & bVar1) << ((byte)uVar9 & 0x1f) | this->value;
    __buf = (void *)(ulong)uVar7;
    this->value = uVar7;
    if ((int)uVar7 < 0) {
      if (uVar4 != uVar8) {
        psVar2 = (string *)__cxa_allocate_exception(0x30);
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Unused negative LEB bits must be 1s","");
        *(string **)psVar2 = psVar2 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar2,local_a8,local_a8 + local_a0);
        *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (uVar4 != 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Unused non-negative LEB bits must be 0s","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_88,local_88 + local_80);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if ((char)bVar1 < '\0') {
      uVar9 = uVar9 + 7;
      if (0x1f < uVar9) {
        psVar2 = (string *)__cxa_allocate_exception(0x30);
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"LEB overflow","");
        *(string **)psVar2 = psVar2 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar2,local_68,local_68 + local_60);
        *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
  } while ((char)bVar1 < '\0');
  if (uVar9 + 7 < 0x20 && 0x3f < bVar1) {
    bVar1 = 0x19 - (char)uVar9;
    iVar3 = (int)(uVar7 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f);
    this->value = iVar3;
    if (-1 < iVar3) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48," LEBsign-extend should produce a negative value","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_48 + local_40);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }